

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O3

void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)

{
  float fVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  uint uVar6;
  MyGame_Example_Monster_mutable_table_t pMVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  MyGame_Example_Monster_mutable_table_t pMVar12;
  MyGame_Example_Monster_mutable_table_t pMVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  MyGame_Example_Monster_mutable_table_t pMVar19;
  MyGame_Example_Monster_mutable_table_t pMVar20;
  size_t sVar21;
  bool bVar22;
  float x__tmp;
  MyGame_Example_Any_mutable_union_t u_00;
  
  pMVar7 = (MyGame_Example_Monster_mutable_table_t)u.value;
  if (u.type == '\x04') {
    if (pMVar7 != (MyGame_Example_Monster_mutable_table_t)0x0) {
      lVar5 = -(long)*(int *)pMVar7;
      if (9 < *(ushort *)(pMVar7 + -(long)*(int *)pMVar7)) {
        uVar18 = (ulong)*(ushort *)(pMVar7 + lVar5 + 8);
        if (uVar18 == 0) {
          pMVar19 = (MyGame_Example_Monster_mutable_table_t)0x0;
        }
        else {
          pMVar19 = pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18 + 4;
        }
        if ((*(ushort *)(pMVar7 + -(long)*(int *)pMVar7) < 0xc) ||
           (uVar18 = (ulong)*(ushort *)(pMVar7 + lVar5 + 10), uVar18 == 0)) {
          pMVar20 = (MyGame_Example_Monster_mutable_table_t)0x0;
        }
        else {
          pMVar20 = pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18 + 4;
        }
        if (pMVar19 == (MyGame_Example_Monster_mutable_table_t)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(uint *)(pMVar19 + -4);
        }
        if (pMVar20 == (MyGame_Example_Monster_mutable_table_t)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(uint *)(pMVar20 + -4);
        }
        if (uVar6 != uVar8) {
          __assert_fail("flatbuffers_vec_len(uv__tmp.type) == flatbuffers_vec_len(uv__tmp.value) && \"union vector type length mismatch\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                        ,0x3d8,
                        "MyGame_Example_Any_union_vec_t MyGame_Example_Alt_manyany_union(MyGame_Example_Alt_table_t)"
                       );
        }
        if ((pMVar19 != (MyGame_Example_Monster_mutable_table_t)0x0) &&
           (uVar6 = *(uint *)(pMVar19 + -4), (ulong)uVar6 != 0)) {
          uVar18 = 0;
          pMVar12 = pMVar20;
          do {
            if (*(uint *)(pMVar19 + -4) <= uVar18) {
              __assert_fail("n__tmp > (i__tmp) && \"index out of range\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                            ,0x386,
                            "MyGame_Example_Any_union_t MyGame_Example_Any_union_vec_at(MyGame_Example_Any_union_vec_t, size_t)"
                           );
            }
            if (pMVar19[uVar18].unused__ == 0) {
              pMVar13 = (MyGame_Example_Monster_mutable_table_t)0x0;
            }
            else {
              if ((pMVar20 == (MyGame_Example_Monster_mutable_table_t)0x0) ||
                 (*(uint *)(pMVar20 + -4) <= uVar18)) {
                __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/flatbuffers_common_reader.h"
                              ,0x93,
                              "flatbuffers_generic_t flatbuffers_generic_vec_at(flatbuffers_generic_vec_t, size_t)"
                             );
              }
              pMVar13 = pMVar12 + *(uint *)pMVar12;
            }
            u_00._1_7_ = 0;
            u_00.type = pMVar19[uVar18].unused__;
            u_00.value = pMVar13;
            MyGame_Example_Any_sort(u_00);
            uVar18 = uVar18 + 1;
            pMVar12 = pMVar12 + 4;
          } while (uVar6 != uVar18);
          lVar5 = -(long)*(int *)pMVar7;
        }
      }
      if ((0xd < *(ushort *)(pMVar7 + lVar5)) &&
         (uVar18 = (ulong)*(ushort *)(pMVar7 + lVar5 + 0xc), uVar18 != 0)) {
        uVar6 = *(uint *)(pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18);
        uVar9 = (ulong)uVar6;
        if (uVar9 != 0) {
          lVar5 = *(uint *)(pMVar7 + uVar18) + uVar18;
          pMVar19 = pMVar7 + lVar5 + 4;
          sVar21 = uVar9 - 1;
          uVar18 = (ulong)(uVar6 >> 1);
          __MyGame_Example_MultipleKeys_sort_by_foobar__heap_sift_down
                    ((MyGame_Example_MultipleKeys_mutable_vec_t)pMVar19,uVar18,sVar21);
          if (uVar9 != 1) {
            do {
              uVar18 = uVar18 - 1;
              __MyGame_Example_MultipleKeys_sort_by_foobar__heap_sift_down
                        ((MyGame_Example_MultipleKeys_mutable_vec_t)pMVar19,uVar18,sVar21);
            } while (uVar18 != 0);
          }
          if (sVar21 != 0) {
            sVar21 = uVar9 - 2;
            iVar11 = uVar6 * -4;
            iVar17 = uVar6 * 4;
            do {
              iVar17 = iVar17 + -4;
              iVar11 = iVar11 + 4;
              iVar3 = *(int *)pMVar19;
              *(int *)pMVar19 = *(int *)(pMVar7 + sVar21 * 4 + lVar5 + 8) + iVar17;
              *(int *)(pMVar7 + sVar21 * 4 + lVar5 + 8) = iVar3 + iVar11;
              __MyGame_Example_MultipleKeys_sort_by_foobar__heap_sift_down
                        ((MyGame_Example_MultipleKeys_mutable_vec_t)pMVar19,0,sVar21);
              bVar22 = sVar21 != 0;
              sVar21 = sVar21 - 1;
            } while (bVar22);
          }
        }
      }
      if ((0xf < *(ushort *)(pMVar7 + -(long)*(int *)pMVar7)) &&
         (uVar18 = (ulong)*(ushort *)(pMVar7 + (0xe - (long)*(int *)pMVar7)), uVar18 != 0)) {
        uVar6 = *(uint *)(pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18);
        if ((ulong)uVar6 != 0) {
          pMVar19 = pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18;
          pMVar20 = pMVar19 + 4;
          uVar18 = (ulong)uVar6 - 1;
          uVar9 = (ulong)(uVar6 >> 1);
          uVar10 = (ulong)(uVar6 & 0xfffffffe);
          uVar16 = uVar9;
          while (uVar10 <= uVar18) {
            uVar14 = (ulong)*(uint *)pMVar19;
            if (uVar10 < uVar18) {
              if ((uVar14 <= uVar10) || (uVar15 = uVar10 | 1, uVar14 <= uVar15)) {
LAB_00113241:
                __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                              ,0x2f5,
                              "Fantasy_Rapunzel_struct_t Fantasy_Rapunzel_vec_at(Fantasy_Rapunzel_vec_t, size_t)"
                             );
              }
              if (*(ushort *)(pMVar20 + uVar15 * 8) <= *(ushort *)(pMVar20 + uVar10 * 8))
              goto LAB_00112e3c;
            }
            else {
LAB_00112e3c:
              uVar15 = uVar10;
            }
            if ((uVar14 <= uVar16) || (uVar14 <= uVar15)) goto LAB_00113241;
            if (*(ushort *)(pMVar20 + uVar15 * 8) <= *(ushort *)(pMVar20 + uVar16 * 8)) break;
            uVar4 = *(undefined8 *)(pMVar20 + uVar15 * 8);
            *(undefined8 *)(pMVar20 + uVar15 * 8) = *(undefined8 *)(pMVar20 + uVar16 * 8);
            *(undefined8 *)(pMVar20 + uVar16 * 8) = uVar4;
            uVar16 = uVar15;
            uVar10 = uVar15 * 2;
          }
          if (uVar6 != 1) {
            do {
              lVar5 = uVar9 * 2;
              uVar9 = uVar9 - 1;
              uVar10 = lVar5 - 2;
              uVar16 = uVar9;
              while (uVar10 <= uVar18) {
                uVar14 = (ulong)*(uint *)pMVar19;
                if (uVar10 < uVar18) {
                  if ((uVar14 <= uVar10) || (uVar15 = uVar10 | 1, uVar14 <= uVar15))
                  goto LAB_00113241;
                  if (*(ushort *)(pMVar20 + uVar15 * 8) <= *(ushort *)(pMVar20 + uVar10 * 8))
                  goto LAB_00112ec3;
                }
                else {
LAB_00112ec3:
                  uVar15 = uVar10;
                }
                if ((uVar14 <= uVar16) || (uVar14 <= uVar15)) goto LAB_00113241;
                if (*(ushort *)(pMVar20 + uVar15 * 8) <= *(ushort *)(pMVar20 + uVar16 * 8)) break;
                uVar4 = *(undefined8 *)(pMVar20 + uVar15 * 8);
                *(undefined8 *)(pMVar20 + uVar15 * 8) = *(undefined8 *)(pMVar20 + uVar16 * 8);
                *(undefined8 *)(pMVar20 + uVar16 * 8) = uVar4;
                uVar16 = uVar15;
                uVar10 = uVar15 * 2;
              }
            } while (uVar9 != 0);
          }
LAB_00112f88:
          if (uVar18 != 0) {
            uVar4 = *(undefined8 *)(pMVar20 + uVar18 * 8);
            *(undefined8 *)(pMVar20 + uVar18 * 8) = *(undefined8 *)pMVar20;
            *(undefined8 *)pMVar20 = uVar4;
            uVar18 = uVar18 - 1;
            uVar9 = 0;
            uVar10 = 0;
            do {
              uVar16 = (ulong)*(uint *)pMVar19;
              if (uVar9 < uVar18) {
                if ((uVar16 <= uVar9) || (uVar14 = uVar9 | 1, uVar16 <= uVar14)) goto LAB_00113241;
                if (*(ushort *)(pMVar20 + uVar14 * 8) <= *(ushort *)(pMVar20 + uVar9 * 8))
                goto LAB_00112f4d;
              }
              else {
LAB_00112f4d:
                uVar14 = uVar9;
              }
              if ((uVar16 <= uVar10) || (uVar16 <= uVar14)) goto LAB_00113241;
              if (*(ushort *)(pMVar20 + uVar14 * 8) <= *(ushort *)(pMVar20 + uVar10 * 8)) break;
              uVar4 = *(undefined8 *)(pMVar20 + uVar14 * 8);
              *(undefined8 *)(pMVar20 + uVar14 * 8) = *(undefined8 *)(pMVar20 + uVar10 * 8);
              *(undefined8 *)(pMVar20 + uVar10 * 8) = uVar4;
              uVar9 = uVar14 * 2;
              uVar10 = uVar14;
            } while (uVar9 <= uVar18);
            goto LAB_00112f88;
          }
        }
      }
      if ((0x11 < *(ushort *)(pMVar7 + -(long)*(int *)pMVar7)) &&
         (uVar18 = (ulong)*(ushort *)(pMVar7 + (0x10 - (long)*(int *)pMVar7)), uVar18 != 0)) {
        uVar6 = *(uint *)(pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18);
        uVar9 = (ulong)uVar6;
        if (uVar9 != 0) {
          lVar5 = *(uint *)(pMVar7 + uVar18) + uVar18;
          pMVar19 = pMVar7 + lVar5 + 4;
          sVar21 = uVar9 - 1;
          uVar18 = (ulong)(uVar6 >> 1);
          __flatbuffers_string__heap_sift_down
                    ((flatbuffers_string_mutable_vec_t)pMVar19,uVar18,sVar21);
          if (uVar9 != 1) {
            do {
              uVar18 = uVar18 - 1;
              __flatbuffers_string__heap_sift_down
                        ((flatbuffers_string_mutable_vec_t)pMVar19,uVar18,sVar21);
            } while (uVar18 != 0);
          }
          if (sVar21 != 0) {
            sVar21 = uVar9 - 2;
            iVar11 = uVar6 * -4;
            iVar17 = uVar6 * 4;
            do {
              iVar17 = iVar17 + -4;
              iVar11 = iVar11 + 4;
              iVar3 = *(int *)pMVar19;
              *(int *)pMVar19 = *(int *)(pMVar7 + sVar21 * 4 + lVar5 + 8) + iVar17;
              *(int *)(pMVar7 + sVar21 * 4 + lVar5 + 8) = iVar3 + iVar11;
              __flatbuffers_string__heap_sift_down
                        ((flatbuffers_string_mutable_vec_t)pMVar19,0,sVar21);
              bVar22 = sVar21 != 0;
              sVar21 = sVar21 - 1;
            } while (bVar22);
          }
        }
      }
      if ((0x13 < *(ushort *)(pMVar7 + -(long)*(int *)pMVar7)) &&
         (uVar18 = (ulong)*(ushort *)(pMVar7 + (0x12 - (long)*(int *)pMVar7)), uVar18 != 0)) {
        uVar6 = *(uint *)(pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18);
        uVar9 = (ulong)uVar6;
        if (uVar9 != 0) {
          pMVar7 = pMVar7 + *(uint *)(pMVar7 + uVar18) + uVar18 + 4;
          uVar18 = uVar9 - 1;
          uVar14 = (ulong)(uVar6 >> 1);
          uVar10 = uVar14;
          for (uVar16 = (ulong)(uVar6 & 0xfffffffe); uVar16 <= uVar18; uVar16 = uVar16 * 2) {
            if (uVar16 < uVar18) {
              if ((uVar9 <= uVar16) || (uVar15 = uVar16 | 1, uVar9 <= uVar15)) {
LAB_00113260:
                __assert_fail("flatbuffers_vec_len(vec__tmp) > (i__tmp) && \"index out of range\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/flatbuffers_common_reader.h"
                              ,0x1e0,
                              "float flatbuffers_float_vec_at(flatbuffers_float_vec_t, size_t)");
              }
              if (*(float *)(pMVar7 + uVar16 * 4) <= *(float *)(pMVar7 + uVar15 * 4) &&
                  *(float *)(pMVar7 + uVar15 * 4) != *(float *)(pMVar7 + uVar16 * 4)) {
                uVar16 = uVar15;
              }
            }
            if ((uVar9 <= uVar10) || (uVar9 <= uVar16)) goto LAB_00113260;
            fVar1 = *(float *)(pMVar7 + uVar16 * 4);
            if (fVar1 <= *(float *)(pMVar7 + uVar10 * 4)) break;
            *(float *)(pMVar7 + uVar16 * 4) = *(float *)(pMVar7 + uVar10 * 4);
            *(float *)(pMVar7 + uVar10 * 4) = fVar1;
            uVar10 = uVar16;
          }
          if (uVar6 != 1) {
            do {
              lVar5 = uVar14 * 2;
              uVar14 = uVar14 - 1;
              uVar16 = lVar5 - 2;
              uVar10 = uVar14;
              while (uVar15 = uVar16, uVar15 <= uVar18) {
                if (uVar15 < uVar18) {
                  if ((uVar9 <= uVar15) || (uVar16 = uVar15 | 1, uVar9 <= uVar16))
                  goto LAB_00113260;
                  if (*(float *)(pMVar7 + uVar15 * 4) <= *(float *)(pMVar7 + uVar16 * 4) &&
                      *(float *)(pMVar7 + uVar16 * 4) != *(float *)(pMVar7 + uVar15 * 4)) {
                    uVar15 = uVar16;
                  }
                }
                if ((uVar9 <= uVar10) || (uVar9 <= uVar15)) goto LAB_00113260;
                fVar1 = *(float *)(pMVar7 + uVar15 * 4);
                if (fVar1 <= *(float *)(pMVar7 + uVar10 * 4)) break;
                *(float *)(pMVar7 + uVar15 * 4) = *(float *)(pMVar7 + uVar10 * 4);
                *(float *)(pMVar7 + uVar10 * 4) = fVar1;
                uVar10 = uVar15;
                uVar16 = uVar15 * 2;
              }
            } while (uVar14 != 0);
          }
LAB_0011322d:
          if (uVar18 != 0) {
            uVar2 = *(undefined4 *)(pMVar7 + uVar18 * 4);
            *(undefined4 *)(pMVar7 + uVar18 * 4) = *(undefined4 *)pMVar7;
            *(undefined4 *)pMVar7 = uVar2;
            uVar18 = uVar18 - 1;
            uVar10 = 0;
            uVar16 = 0;
            do {
              uVar14 = uVar10;
              if (uVar10 < uVar18) {
                if ((uVar9 <= uVar10) || (uVar15 = uVar10 | 1, uVar9 <= uVar15)) goto LAB_00113260;
                if (*(float *)(pMVar7 + uVar10 * 4) <= *(float *)(pMVar7 + uVar15 * 4) &&
                    *(float *)(pMVar7 + uVar15 * 4) != *(float *)(pMVar7 + uVar10 * 4)) {
                  uVar14 = uVar15;
                }
              }
              if ((uVar9 <= uVar16) || (uVar9 <= uVar14)) goto LAB_00113260;
              fVar1 = *(float *)(pMVar7 + uVar14 * 4);
              if (fVar1 <= *(float *)(pMVar7 + uVar16 * 4)) break;
              *(float *)(pMVar7 + uVar14 * 4) = *(float *)(pMVar7 + uVar16 * 4);
              *(float *)(pMVar7 + uVar16 * 4) = fVar1;
              uVar10 = uVar14 * 2;
              uVar16 = uVar14;
            } while (uVar10 <= uVar18);
            goto LAB_0011322d;
          }
        }
      }
    }
  }
  else if (u.type == '\x01') {
    MyGame_Example_Monster_sort(pMVar7);
    return;
  }
  return;
}

Assistant:

static void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)
{
    switch (u.type) {
    case MyGame_Example_Any_Monster: MyGame_Example_Monster_sort(u.value); break;
    case MyGame_Example_Any_Alt: MyGame_Example_Alt_sort(u.value); break;
    default: break;
    }
}